

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_integer<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  element_type *peVar1;
  char_type_conflict cVar2;
  byte bVar3;
  allocator<char> local_2d2;
  allocator<char> local_2d1;
  string local_2d0;
  string local_2b0;
  location first;
  source_location src;
  region local_1d0;
  source_location local_168;
  source_location prefix_src;
  error_info local_78;
  
  location::location(&first,loc);
  peVar1 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (loc->location_ <
      (ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start)) {
    cVar2 = location::current(loc);
    if (cVar2 != '+') {
      cVar2 = location::current(loc);
      if (cVar2 != '-') goto LAB_00333de7;
    }
    location::advance(loc,1);
  }
LAB_00333de7:
  peVar1 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (loc->location_ <
      (ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start)) {
    cVar2 = location::current(loc);
    if (cVar2 == '0') {
      location::advance(loc,1);
      peVar1 = (loc->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (loc->location_ <
          (ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start)) {
        bVar3 = location::current(loc);
        region::region((region *)&src,loc);
        source_location::source_location(&prefix_src,(region *)&src);
        region::~region((region *)&src);
        location::operator=(loc,&first);
        if (bVar3 == 0x78) {
          parse_hex_integer<toml::type_config>(__return_storage_ptr__,loc,ctx);
        }
        else if (bVar3 == 0x6f) {
          parse_oct_integer<toml::type_config>(__return_storage_ptr__,loc,ctx);
        }
        else if (bVar3 == 0x62) {
          parse_bin_integer<toml::type_config>(__return_storage_ptr__,loc,ctx);
        }
        else {
          if (9 < bVar3 - 0x30) {
            source_location::~source_location(&prefix_src);
            goto LAB_00333fde;
          }
          region::region(&local_1d0,loc);
          source_location::source_location(&src,&local_1d0);
          region::~region(&local_1d0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2b0,
                     "toml::parse_integer: leading zero in an decimal integer is not allowed",
                     &local_2d1);
          source_location::source_location(&local_168,&src);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2d0,"leading zero",&local_2d2);
          make_error_info<>((error_info *)&local_1d0,&local_2b0,&local_168,&local_2d0);
          err<toml::error_info>((failure<toml::error_info> *)&local_78,(error_info *)&local_1d0);
          result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                    (__return_storage_ptr__,(failure_type *)&local_78);
          error_info::~error_info(&local_78);
          error_info::~error_info((error_info *)&local_1d0);
          std::__cxx11::string::~string((string *)&local_2d0);
          source_location::~source_location(&local_168);
          std::__cxx11::string::~string((string *)&local_2b0);
          source_location::~source_location(&src);
        }
        source_location::~source_location(&prefix_src);
        goto LAB_00333ff9;
      }
    }
  }
LAB_00333fde:
  location::operator=(loc,&first);
  parse_dec_integer<toml::type_config>(__return_storage_ptr__,loc,ctx);
LAB_00333ff9:
  location::~location(&first);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_integer(location& loc, const context<TC>& ctx)
{
    const auto first = loc;

    if( ! loc.eof() && (loc.current() == '+' || loc.current() == '-'))
    {
        // skip +/- to diagnose +0xDEADBEEF or -0b0011 (invalid).
        // without this, +0xDEAD_BEEF will be parsed as a decimal int and
        // unexpected "xDEAD_BEEF" will appear after integer "+0".
        loc.advance();
    }

    if( ! loc.eof() && loc.current() == '0')
    {
        loc.advance();
        if(loc.eof())
        {
            // `[+-]?0`. parse as an decimal integer.
            loc = first;
            return parse_dec_integer(loc, ctx);
        }

        const auto prefix = loc.current();
        auto prefix_src = source_location(region(loc));

        loc = first;

        if(prefix == 'b') {return parse_bin_integer(loc, ctx);}
        if(prefix == 'o') {return parse_oct_integer(loc, ctx);}
        if(prefix == 'x') {return parse_hex_integer(loc, ctx);}

        if(std::isdigit(prefix))
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_integer: "
                "leading zero in an decimal integer is not allowed",
                std::move(src), "leading zero"));
        }
    }

    loc = first;
    return parse_dec_integer(loc, ctx);
}